

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageBufferVariable(Instruction *this)

{
  Op OVar1;
  uint32_t uVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  undefined1 local_31;
  Instruction *var_type;
  StorageClass storage_class;
  Instruction *this_local;
  
  OVar1 = opcode(this);
  if (OVar1 == OpVariable) {
    uVar2 = GetSingleWordInOperand(this,0);
    if ((uVar2 == 0xc) || (uVar2 == 2)) {
      this_00 = context(this);
      this_01 = IRContext::get_def_use_mgr(this_00);
      uVar2 = type_id(this);
      this_02 = analysis::DefUseManager::GetDef(this_01,uVar2);
      local_31 = false;
      if (this_02 != (Instruction *)0x0) {
        local_31 = IsVulkanStorageBuffer(this_02);
      }
      this_local._7_1_ = local_31;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsVulkanStorageBufferVariable() const {
  if (opcode() != spv::Op::OpVariable) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kVariableStorageClassIndex));
  if (storage_class == spv::StorageClass::StorageBuffer ||
      storage_class == spv::StorageClass::Uniform) {
    Instruction* var_type = context()->get_def_use_mgr()->GetDef(type_id());
    return var_type != nullptr && var_type->IsVulkanStorageBuffer();
  }

  return false;
}